

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O1

Entity __thiscall avro::json::loadEntity(json *this,InputStream *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  any extraout_RDX;
  Entity EVar2;
  JsonParser p;
  JsonParser local_c8;
  
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8.stateStack.c.
  super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>::
  _M_initialize_map((_Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                     *)&local_c8,0);
  paVar1 = &local_c8.sv.field_2;
  local_c8.sv.field_2._M_local_buf[0] = '\0';
  local_c8.sv._M_string_length = 0;
  local_c8.peeked = false;
  local_c8.hasNext = false;
  local_c8.curState = stValue;
  local_c8.in_.next_ = (uint8_t *)0x0;
  local_c8.in_.end_ = (uint8_t *)0x0;
  local_c8.in_.in_ = in;
  local_c8.sv._M_dataplus._M_p = (pointer)paVar1;
  readEntity(this,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sv._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.sv._M_dataplus._M_p,
                    CONCAT71(local_c8.sv.field_2._M_allocated_capacity._1_7_,
                             local_c8.sv.field_2._M_local_buf[0]) + 1);
  }
  std::_Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>::
  ~_Deque_base((_Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                *)&local_c8);
  EVar2.value_.content = extraout_RDX.content;
  EVar2._0_8_ = this;
  return EVar2;
}

Assistant:

Entity loadEntity(InputStream& in)
{
    JsonParser p;
    p.init(in);
    return readEntity(p);
}